

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_psbt.cpp
# Opt level: O2

void __thiscall cfd::Psbt::Psbt(Psbt *this,Transaction *transaction)

{
  _Rb_tree_header *p_Var1;
  
  cfd::core::Psbt::Psbt(&this->super_Psbt,transaction);
  *(undefined ***)this = &PTR__Psbt_002cf078;
  p_Var1 = &(this->verify_ignore_map_)._M_t._M_impl.super__Rb_tree_header;
  (this->verify_ignore_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->verify_ignore_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (this->verify_ignore_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->verify_ignore_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->verify_ignore_map_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

Psbt::Psbt(const Transaction& transaction) : cfd::core::Psbt(transaction) {}